

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 roundAndPackFloat32(flag zSign,int zExp,uint32_t zSig,float_status *status)

{
  char cVar1;
  float32 fVar2;
  bool bVar3;
  bool local_31;
  byte local_24;
  char local_23;
  _Bool overflow_to_inf;
  flag isTiny;
  int8_t roundBits;
  int8_t roundIncrement;
  flag roundNearestEven;
  int8_t roundingMode;
  float_status *status_local;
  uint32_t zSig_local;
  int zExp_local;
  flag zSign_local;
  
  cVar1 = status->float_rounding_mode;
  status_local._0_4_ = zSig;
  status_local._4_4_ = zExp;
  zSig_local._3_1_ = zSign;
  switch(cVar1) {
  case '\0':
  case '\x04':
    local_23 = '@';
    break;
  case '\x01':
    local_23 = '\0';
    if (zSign != '\0') {
      local_23 = '\x7f';
    }
    break;
  case '\x02':
    local_23 = '\x7f';
    if (zSign != '\0') {
      local_23 = '\0';
    }
    break;
  case '\x03':
    local_23 = '\0';
    break;
  case '\x05':
    local_23 = '\x7f';
    if ((zSig & 0x80) != 0) {
      local_23 = '\0';
    }
    break;
  default:
    abort();
  }
  local_24 = (byte)zSig & 0x7f;
  if (0xfc < (zExp & 0xffffU)) {
    if ((0xfd < zExp) || ((zExp == 0xfd && ((int)(zSig + (int)local_23) < 0)))) {
      local_31 = cVar1 != '\x05' && local_23 != '\0';
      float_raise_tricore('(',status);
      fVar2 = packFloat32(zSig_local._3_1_,0xff,-(uint)((local_31 ^ 0xffU) & 1));
      return fVar2;
    }
    if (zExp < 0) {
      if (status->flush_to_zero != '\0') {
        float_raise_tricore(0x80,status);
        fVar2 = packFloat32(zSig_local._3_1_,0,0);
        return fVar2;
      }
      bVar3 = true;
      if ((status->float_detect_tininess != '\x01') && (bVar3 = true, -2 < zExp)) {
        bVar3 = zSig + (int)local_23 < 0x80000000;
      }
      shift32RightJamming(zSig,-zExp,(uint32_t *)&status_local);
      status_local._4_4_ = 0;
      local_24 = (byte)(uint32_t)status_local & 0x7f;
      if ((bVar3) && (((uint32_t)status_local & 0x7f) != 0)) {
        float_raise_tricore('\x10',status);
      }
      if ((cVar1 == '\x05') && (local_23 = '\x7f', ((uint32_t)status_local & 0x80) != 0)) {
        local_23 = '\0';
      }
    }
  }
  if (local_24 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  status_local._0_4_ =
       ((local_24 == 0x40 && cVar1 == '\0') ^ 0xffffffff) &
       (uint32_t)status_local + (int)local_23 >> 7;
  if ((uint32_t)status_local == 0) {
    status_local._4_4_ = 0;
  }
  fVar2 = packFloat32(zSig_local._3_1_,status_local._4_4_,(uint32_t)status_local);
  return fVar2;
}

Assistant:

static float32 roundAndPackFloat32(flag zSign, int zExp, uint32_t zSig,
                                   float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven;
    int8_t roundIncrement, roundBits;
    flag isTiny;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        roundIncrement = 0x40;
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : 0x7f;
        break;
    case float_round_down:
        roundIncrement = zSign ? 0x7f : 0;
        break;
    case float_round_to_odd:
        roundIncrement = zSig & 0x80 ? 0 : 0x7f;
        break;
    default:
        abort();
        break;
    }
    roundBits = zSig & 0x7F;
    if ( 0xFD <= (uint16_t) zExp ) {
        if (    ( 0xFD < zExp )
             || (    ( zExp == 0xFD )
                  && ( (int32_t) ( zSig + roundIncrement ) < 0 ) )
           ) {
            bool overflow_to_inf = roundingMode != float_round_to_odd &&
                                   roundIncrement != 0;
            float_raise(float_flag_overflow | float_flag_inexact, status);
            return packFloat32(zSign, 0xFF, -!overflow_to_inf);
        }
        if ( zExp < 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloat32(zSign, 0, 0);
            }
            isTiny =
                (status->float_detect_tininess
                 == float_tininess_before_rounding)
                || ( zExp < -1 )
                || ( zSig + roundIncrement < 0x80000000 );
            shift32RightJamming( zSig, - zExp, &zSig );
            zExp = 0;
            roundBits = zSig & 0x7F;
            if (isTiny && roundBits) {
                float_raise(float_flag_underflow, status);
            }
            if (roundingMode == float_round_to_odd) {
                /*
                 * For round-to-odd case, the roundIncrement depends on
                 * zSig which just changed.
                 */
                roundIncrement = zSig & 0x80 ? 0 : 0x7f;
            }
        }
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    zSig = ( zSig + roundIncrement )>>7;
    zSig &= ~ ( ( ( roundBits ^ 0x40 ) == 0 ) & roundNearestEven );
    if ( zSig == 0 ) zExp = 0;
    return packFloat32( zSign, zExp, zSig );

}